

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

string * __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::getGSCode_abi_cxx11_
          (string *__return_storage_ptr__,GeometryShaderInvalidArrayedInputVariablesTest *this,
          GLenum gs_input_primitive_type)

{
  ostream *poVar1;
  char *this_00;
  stringstream code_sstream;
  string local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (";
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nlayout (",0x2f);
  getInputPrimitiveTypeQualifier_abi_cxx11_
            (&local_1c8,(GeometryShaderInvalidArrayedInputVariablesTest *)this_00,
             gs_input_primitive_type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") in;\nlayout (points, max_vertices = 1) out;\n\nin vec4 data[",0x3b);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"];\n\nvoid main()\n{\n    gl_Position = data[",0x29);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n    EmitVertex();\n}\n",0x17);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string GeometryShaderInvalidArrayedInputVariablesTest::getGSCode(glw::GLenum gs_input_primitive_type) const
{
	std::stringstream  code_sstream;
	const unsigned int valid_array_size = getValidInputVariableArraySize(gs_input_primitive_type);

	code_sstream << "${VERSION}\n"
					"${GEOMETRY_SHADER_REQUIRE}\n"
					"\n"
					"layout ("
				 << getInputPrimitiveTypeQualifier(gs_input_primitive_type)
				 << ") in;\n"
					"layout (points, max_vertices = 1) out;\n"
					"\n"
					"in vec4 data["
				 << (valid_array_size + 1) << "];\n"
											  "\n"
											  "void main()\n"
											  "{\n"
											  "    gl_Position = data["
				 << valid_array_size << "];\n"
										"    EmitVertex();\n"
										"}\n";

	return code_sstream.str();
}